

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

string * __thiscall
pbrt::ConductorMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,ConductorMaterial *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,bool_const&>
            (__return_storage_ptr__,
             "[ ConductorMaterial displacement: %s eta: %s k: %s uRoughness: %s vRoughness: %s remapRoughness: %s]"
             ,&this->displacement,&this->eta,&this->k,&this->uRoughness,&this->vRoughness,
             &this->remapRoughness);
  return __return_storage_ptr__;
}

Assistant:

std::string ConductorMaterial::ToString() const {
    return StringPrintf(
        "[ ConductorMaterial displacement: %s eta: %s k: %s uRoughness: %s "
        "vRoughness: %s remapRoughness: %s]",
        displacement, eta, k, uRoughness, vRoughness, remapRoughness);
}